

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistent_cohomology_column.h
# Opt level: O2

bool Gudhi::persistent_cohomology::operator<
               (Persistent_cohomology_column<unsigned_int,_int> *c1,
               Persistent_cohomology_column<unsigned_int,_int> *c2)

{
  int iVar1;
  int iVar2;
  node_ptr plVar3;
  node_ptr plVar4;
  Col_type *pCVar5;
  
  pCVar5 = &c2->col_;
  plVar3 = (node_ptr)pCVar5;
  plVar4 = (node_ptr)&c1->col_;
  do {
    plVar4 = (((type *)&plVar4->next_)->data_).root_plus_size_.m_header.super_node.next_;
    plVar3 = (((type *)&plVar3->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if ((plVar4 == (node_ptr)&c1->col_) || (plVar3 == (node_ptr)pCVar5)) {
      return plVar3 != (node_ptr)pCVar5;
    }
    if (*(uint *)&plVar4[1].next_ != *(uint *)&plVar3[1].next_) {
      return *(uint *)&plVar4[1].next_ < *(uint *)&plVar3[1].next_;
    }
    iVar1 = *(int *)((long)&plVar3[1].next_ + 4);
    iVar2 = *(int *)((long)&plVar4[1].next_ + 4);
  } while (iVar2 == iVar1);
  return iVar2 < iVar1;
}

Assistant:

bool operator<(const Persistent_cohomology_column& c1,
                        const Persistent_cohomology_column& c2) {
    typename Col_type::const_iterator it1 = c1.col_.begin();
    typename Col_type::const_iterator it2 = c2.col_.begin();
    while (it1 != c1.col_.end() && it2 != c2.col_.end()) {
      if (it1->key_ == it2->key_) {
        if (it1->coefficient_ == it2->coefficient_) {
          ++it1;
          ++it2;
        } else {
          return it1->coefficient_ < it2->coefficient_;
        }
      } else {
        return it1->key_ < it2->key_;
      }
    }
    return (it2 != c2.col_.end());
  }